

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

bool Peeps::IsJccOrShiftInstr(Instr *instr)

{
  bool bVar1;
  byte bVar2;
  BranchInstr *this;
  int iVar3;
  
  if (instr->m_kind == InstrKindBranch) {
    this = IR::Instr::AsBranchInstr(instr);
    bVar1 = IR::BranchInstr::IsConditional(this);
    bVar2 = 1;
    if (bVar1) goto LAB_005adb50;
  }
  iVar3 = *(int *)&instr->m_opcode + -0x491;
  if ((ushort)iVar3 < 0x10) {
    bVar2 = (byte)(0xe001 >> ((byte)iVar3 & 0x1f));
  }
  else {
    bVar2 = 0;
  }
LAB_005adb50:
  return (bool)(bVar2 & 1);
}

Assistant:

bool
Peeps::IsJccOrShiftInstr(IR::Instr *instr)
{
    bool instrFound = (instr->IsBranchInstr() && instr->AsBranchInstr()->IsConditional()) ||
        (instr->m_opcode == Js::OpCode::SHL) || (instr->m_opcode == Js::OpCode::SHR) || (instr->m_opcode == Js::OpCode::SAR);

#if defined(_M_X64)
    instrFound = instrFound || (instr->m_opcode == Js::OpCode::SHLD);
#endif

    return (instrFound);
}